

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vgatherqd_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  byte bVar2;
  Int32 IVar3;
  bool bVar4;
  
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
LAB_0012998d:
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') goto LAB_0012998d;
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
    if (UVar1 == '\x01') goto LAB_0012999e;
    bVar2 = 0;
LAB_00129a6b:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpgatherqd",0xb);
    (pMyDisasm->Reserved_).EVEX.masking = '\x01';
    UVar1 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar1 != '\x01') {
      if (UVar1 != '\0') {
        if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
          return;
        }
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).VSIB_ = 0x10;
        (pMyDisasm->Reserved_).Register_ = 0x10;
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        goto LAB_00129b43;
      }
      bVar4 = bVar2 != 0;
      IVar3 = 0x110000;
      if (bVar4) {
        IVar3 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar3;
      (pMyDisasm->Reserved_).VSIB_ = 4;
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      goto joined_r0x00129ac4;
    }
    (pMyDisasm->Instruction).Category = (uint)bVar2 * 0x20000 + 0x120000;
    (pMyDisasm->Reserved_).VSIB_ = 8;
    (pMyDisasm->Reserved_).Register_ = 8;
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
  }
  else {
    if (UVar1 == '\x01') {
LAB_0012999e:
      bVar2 = 1;
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') goto LAB_00129a6b;
    }
    else {
      bVar2 = 0;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpgatherqq",0xb);
    (pMyDisasm->Reserved_).EVEX.masking = '\x01';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    UVar1 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar1 != '\x01') {
      if (UVar1 != '\0') {
        if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
          return;
        }
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).VSIB_ = 0x10;
        (pMyDisasm->Reserved_).Register_ = 0x10;
        goto LAB_00129b43;
      }
      bVar4 = bVar2 != 0;
      IVar3 = 0x110000;
      if (bVar4) {
        IVar3 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar3;
      (pMyDisasm->Reserved_).VSIB_ = 4;
      (pMyDisasm->Reserved_).Register_ = 4;
joined_r0x00129ac4:
      if (bVar4) goto LAB_00129b43;
      goto LAB_00129af8;
    }
    (pMyDisasm->Instruction).Category = (uint)bVar2 * 0x20000 + 0x120000;
    (pMyDisasm->Reserved_).VSIB_ = 8;
    (pMyDisasm->Reserved_).Register_ = 8;
  }
  if (bVar2 != 0) {
LAB_00129b43:
    GxEx(pMyDisasm);
    return;
  }
LAB_00129af8:
  GxExVEX(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  (pMyDisasm->Operand3).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ vgatherqd_(PDISASM pMyDisasm)
{
 /* ========== 0x66 */
 if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
   GV.OperandSize = GV.OriginalOperandSize;
   pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
   if (GV.VEX.state == InUsePrefix) {
     if (
         ((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
       ) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpgatherqd");
       #endif
       GV.EVEX.masking = MERGING;
       if (GV.VEX.L == 0) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         GV.VSIB_ = SSE_REG;
         GV.Register_ = SSE_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GV.MemDecoration = Arg2qword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.MemDecoration = Arg2qword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.VEX.L == 0x1) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
         GV.VSIB_ = AVX_REG;

         if (GV.EVEX.state != InUsePrefix) {
           GV.Register_ = AVX_REG;
           GV.MemDecoration = Arg2qword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.Register_ = AVX_REG;
           GV.MemDecoration = Arg2qword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.EVEX.LL == 0x2) {
         GV.EVEX.tupletype = TUPLE1_SCALAR;
         pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
         GV.VSIB_ = AVX512_REG;
         GV.Register_ = AVX512_REG;
         GV.MemDecoration = Arg2qword;
         GxEx(pMyDisasm);

       }

     } else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpgatherqq");
       #endif
       GV.EVEX.masking = MERGING;
       GV.MemDecoration = Arg2qword;
       if (GV.VEX.L == 0) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         GV.VSIB_ = SSE_REG;
         GV.Register_ = SSE_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;

         }
         else {
           GxEx(pMyDisasm);
         }

       }
       else if (GV.VEX.L == 0x1) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
         GV.VSIB_ = AVX_REG;
         GV.Register_ = AVX_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GV.MemDecoration = Arg2qword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;

         }
         else {
           GV.MemDecoration = Arg2qword;
           GxEx(pMyDisasm);
         }

       }
       else if (GV.EVEX.LL == 0x2) {
         GV.EVEX.tupletype = TUPLE1_SCALAR;
         pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
         GV.VSIB_ = AVX512_REG;
         GV.Register_ = AVX512_REG;
         GV.MemDecoration = Arg2qword;
         GxEx(pMyDisasm);

       }
     }
   } else {
     failDecode(pMyDisasm);
   }
 }
 else {
   failDecode(pMyDisasm);
 }
}